

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiListClipperRange>::push_back
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ImGuiListClipperRange *pIVar3;
  undefined8 *in_RSI;
  ImVector<ImGuiListClipperRange> *in_RDI;
  ImVector<ImGuiListClipperRange> *unaff_retaddr;
  ImVector<ImGuiListClipperRange> *pIVar4;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar4 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar4 >> 0x20));
  }
  pIVar3 = in_RDI->Data + in_RDI->Size;
  uVar2 = *in_RSI;
  pIVar3->Min = (int)uVar2;
  pIVar3->Max = (int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined4 *)(in_RSI + 1);
  pIVar3->PosToIndexConvert = (bool)(char)uVar1;
  pIVar3->PosToIndexOffsetMin = (char)((uint)uVar1 >> 8);
  pIVar3->PosToIndexOffsetMax = (char)((uint)uVar1 >> 0x10);
  pIVar3->field_0xb = (char)((uint)uVar1 >> 0x18);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }